

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_compact_optional.cpp
# Opt level: O2

void test_bool_storage(void)

{
  uint __line;
  reference_type rVar1;
  char *__assertion;
  compact_optional_base<ak_toolbox::compact_optional_ns::evp_bool> local_a;
  compact_optional_base<ak_toolbox::compact_optional_ns::evp_bool> local_9 [7];
  opt_bool obT;
  opt_bool obF;
  
  local_a.super_type.value_ = (type)'\x01';
  local_9[0].super_type.value_ = (type)'\0';
  rVar1 = ak_toolbox::compact_optional_ns::detail_::
          compact_optional_base<ak_toolbox::compact_optional_ns::evp_bool>::value(&local_a);
  if (rVar1) {
    rVar1 = ak_toolbox::compact_optional_ns::detail_::
            compact_optional_base<ak_toolbox::compact_optional_ns::evp_bool>::value(local_9);
    if (!rVar1) {
      return;
    }
    __assertion = "obF.value() == false";
    __line = 0x70;
  }
  else {
    __assertion = "obT.value() == true";
    __line = 0x6d;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/akrzemi1[P]compact_optional/test_compact_optional.cpp"
                ,__line,"void test_bool_storage()");
}

Assistant:

void test_bool_storage()
{
  typedef compact_optional<evp_bool> opt_bool;
  static_assert (sizeof(opt_bool) == 1, "size waste");
  
  opt_bool ob_, obT(true), obF(false);
  assert (!ob_.has_value());
  
  assert (obT.has_value());
  assert (obT.value() == true);
  
  assert (obF.has_value());
  assert (obF.value() == false);
}